

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O3

void mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint *puVar5;
  long lVar6;
  long lVar7;
  byte bVar8;
  ushort uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  byte *pbVar13;
  ulong uVar14;
  byte bVar15;
  long *in_RSI;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  mz_uint32 t;
  long lVar21;
  byte *pbVar22;
  byte *pbVar23;
  bool bVar24;
  
  uVar17 = (uint)pZip;
  if (1 < uVar17) {
    puVar5 = (uint *)in_RSI[8];
    uVar20 = (ulong)pZip & 0xffffffff;
    uVar11 = (ulong)(uVar17 - 2 >> 1);
    do {
      uVar10 = uVar11 * 2 + 1;
      if (uVar10 < uVar20) {
        lVar6 = *in_RSI;
        lVar7 = in_RSI[4];
        uVar18 = uVar11;
        do {
          if (uVar18 * 2 + 2 < uVar20) {
            uVar14 = (ulong)*(uint *)(lVar7 + (ulong)puVar5[uVar10] * 4);
            uVar12 = (ulong)*(uint *)(lVar7 + (ulong)puVar5[uVar18 * 2 + 2] * 4);
            lVar16 = lVar6 + uVar14;
            pbVar13 = (byte *)(lVar16 + 0x2e);
            uVar2 = *(ushort *)(lVar16 + 0x1c);
            uVar3 = *(ushort *)(lVar6 + 0x1c + uVar12);
            uVar9 = uVar3;
            if (uVar2 < uVar3) {
              uVar9 = uVar2;
            }
            pbVar23 = (byte *)((ulong)uVar9 + uVar14 + lVar6 + 0x2e);
            if (uVar9 == 0) {
              bVar8 = 0;
              bVar15 = 0;
            }
            else {
              pbVar22 = (byte *)(uVar12 + lVar6 + 0x2e);
              do {
                bVar15 = *pbVar13;
                bVar8 = bVar15 + 0x20;
                if (0x19 < (byte)(bVar15 + 0xbf)) {
                  bVar8 = bVar15;
                }
                bVar1 = *pbVar22;
                bVar15 = bVar1 + 0x20;
                if (0x19 < (byte)(bVar1 + 0xbf)) {
                  bVar15 = bVar1;
                }
                if (bVar8 != bVar15) break;
                pbVar13 = pbVar13 + 1;
                pbVar22 = pbVar22 + 1;
                bVar15 = bVar8;
              } while (pbVar13 < pbVar23);
            }
            bVar24 = bVar8 < bVar15;
            if (pbVar13 == pbVar23) {
              bVar24 = uVar2 < uVar3;
            }
            uVar14 = (ulong)bVar24;
          }
          else {
            uVar14 = 0;
          }
          uVar14 = uVar14 + uVar10;
          uVar4 = puVar5[uVar18];
          uVar12 = (ulong)*(uint *)(lVar7 + (ulong)uVar4 * 4);
          uVar10 = (ulong)*(uint *)(lVar7 + (ulong)puVar5[uVar14] * 4);
          lVar16 = lVar6 + uVar12;
          pbVar13 = (byte *)(lVar16 + 0x2e);
          uVar2 = *(ushort *)(lVar16 + 0x1c);
          uVar3 = *(ushort *)(lVar6 + 0x1c + uVar10);
          uVar9 = uVar3;
          if (uVar2 < uVar3) {
            uVar9 = uVar2;
          }
          pbVar23 = (byte *)((ulong)uVar9 + uVar12 + lVar6 + 0x2e);
          if (uVar9 == 0) {
            bVar8 = 0;
            bVar15 = 0;
          }
          else {
            pbVar22 = (byte *)(uVar10 + lVar6 + 0x2e);
            do {
              bVar15 = *pbVar13;
              bVar8 = bVar15 + 0x20;
              if (0x19 < (byte)(bVar15 + 0xbf)) {
                bVar8 = bVar15;
              }
              bVar1 = *pbVar22;
              bVar15 = bVar1 + 0x20;
              if (0x19 < (byte)(bVar1 + 0xbf)) {
                bVar15 = bVar1;
              }
              if (bVar8 != bVar15) break;
              pbVar13 = pbVar13 + 1;
              pbVar22 = pbVar22 + 1;
              bVar15 = bVar8;
            } while (pbVar13 < pbVar23);
          }
          bVar24 = bVar15 <= bVar8;
          if (pbVar13 == pbVar23) {
            bVar24 = uVar3 <= uVar2;
          }
          if (bVar24) break;
          puVar5[uVar18] = puVar5[uVar14];
          puVar5[uVar14] = uVar4;
          uVar10 = uVar14 * 2 + 1;
          uVar18 = uVar14;
        } while (uVar10 < uVar20);
      }
      bVar24 = uVar11 != 0;
      uVar11 = uVar11 - 1;
    } while (bVar24);
    uVar11 = (ulong)(uVar17 - 1);
    do {
      uVar17 = puVar5[uVar11];
      puVar5[uVar11] = *puVar5;
      *puVar5 = uVar17;
      if (1 < uVar11) {
        lVar6 = *in_RSI;
        lVar7 = in_RSI[4];
        uVar20 = 1;
        lVar16 = 0;
        lVar19 = 0;
        do {
          if (lVar16 + 2U < uVar11) {
            uVar18 = (ulong)*(uint *)(lVar7 + (ulong)puVar5[uVar20] * 4);
            uVar10 = (ulong)*(uint *)(lVar7 + (ulong)puVar5[lVar16 + 2] * 4);
            lVar16 = lVar6 + uVar18;
            pbVar13 = (byte *)(lVar16 + 0x2e);
            uVar2 = *(ushort *)(lVar16 + 0x1c);
            uVar3 = *(ushort *)(lVar6 + 0x1c + uVar10);
            uVar9 = uVar3;
            if (uVar2 < uVar3) {
              uVar9 = uVar2;
            }
            pbVar23 = (byte *)((ulong)uVar9 + uVar18 + lVar6 + 0x2e);
            if (uVar9 == 0) {
              bVar15 = 0;
              bVar8 = 0;
            }
            else {
              pbVar22 = (byte *)(uVar10 + lVar6 + 0x2e);
              do {
                bVar8 = *pbVar13;
                bVar15 = bVar8 + 0x20;
                if (0x19 < (byte)(bVar8 + 0xbf)) {
                  bVar15 = bVar8;
                }
                bVar1 = *pbVar22;
                bVar8 = bVar1 + 0x20;
                if (0x19 < (byte)(bVar1 + 0xbf)) {
                  bVar8 = bVar1;
                }
                if (bVar15 != bVar8) break;
                pbVar13 = pbVar13 + 1;
                pbVar22 = pbVar22 + 1;
                bVar8 = bVar15;
              } while (pbVar13 < pbVar23);
            }
            bVar24 = bVar15 < bVar8;
            if (pbVar13 == pbVar23) {
              bVar24 = uVar2 < uVar3;
            }
            uVar10 = (ulong)bVar24;
          }
          else {
            uVar10 = 0;
          }
          lVar21 = uVar10 + uVar20;
          uVar10 = (ulong)*(uint *)(lVar7 + (ulong)uVar17 * 4);
          uVar20 = (ulong)*(uint *)(lVar7 + (ulong)puVar5[lVar21] * 4);
          lVar16 = lVar6 + uVar10;
          pbVar13 = (byte *)(lVar16 + 0x2e);
          uVar2 = *(ushort *)(lVar16 + 0x1c);
          uVar3 = *(ushort *)(lVar6 + 0x1c + uVar20);
          uVar9 = uVar3;
          if (uVar2 < uVar3) {
            uVar9 = uVar2;
          }
          pbVar23 = (byte *)((ulong)uVar9 + uVar10 + lVar6 + 0x2e);
          if (uVar9 == 0) {
            bVar15 = 0;
            bVar8 = 0;
          }
          else {
            pbVar22 = (byte *)(uVar20 + lVar6 + 0x2e);
            do {
              bVar8 = *pbVar13;
              bVar15 = bVar8 + 0x20;
              if (0x19 < (byte)(bVar8 + 0xbf)) {
                bVar15 = bVar8;
              }
              bVar1 = *pbVar22;
              bVar8 = bVar1 + 0x20;
              if (0x19 < (byte)(bVar1 + 0xbf)) {
                bVar8 = bVar1;
              }
              if (bVar15 != bVar8) break;
              pbVar13 = pbVar13 + 1;
              pbVar22 = pbVar22 + 1;
              bVar8 = bVar15;
            } while (pbVar13 < pbVar23);
          }
          bVar24 = bVar8 <= bVar15;
          if (pbVar13 == pbVar23) {
            bVar24 = uVar3 <= uVar2;
          }
          if (bVar24) break;
          puVar5[lVar19] = puVar5[lVar21];
          puVar5[lVar21] = uVar17;
          lVar16 = lVar21 * 2;
          uVar20 = lVar21 * 2 + 1;
          lVar19 = lVar21;
        } while (uVar20 < uVar11);
      }
      uVar11 = uVar11 - 1;
    } while ((int)uVar11 != 0);
  }
  return;
}

Assistant:

static void mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip)
{
    mz_zip_internal_state *pState = pZip->m_pState;
    const mz_zip_array *pCentral_dir_offsets = &pState->m_central_dir_offsets;
    const mz_zip_array *pCentral_dir = &pState->m_central_dir;
    mz_uint32 *pIndices;
    mz_uint32 start, end;
    const mz_uint32 size = pZip->m_total_files;

    if (size <= 1U)
        return;

    pIndices = &MZ_ZIP_ARRAY_ELEMENT(&pState->m_sorted_central_dir_offsets, mz_uint32, 0);

    start = (size - 2U) >> 1U;
    for (;;)
    {
        mz_uint64 child, root = start;
        for (;;)
        {
            if ((child = (root << 1U) + 1U) >= size)
                break;
            child += (((child + 1U) < size) && (mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[child], pIndices[child + 1U])));
            if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[root], pIndices[child]))
                break;
            MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
            root = child;
        }
        if (!start)
            break;
        start--;
    }

    end = size - 1;
    while (end > 0)
    {
        mz_uint64 child, root = 0;
        MZ_SWAP_UINT32(pIndices[end], pIndices[0]);
        for (;;)
        {
            if ((child = (root << 1U) + 1U) >= end)
                break;
            child += (((child + 1U) < end) && mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[child], pIndices[child + 1U]));
            if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[root], pIndices[child]))
                break;
            MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
            root = child;
        }
        end--;
    }
}